

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::StringRef::compare(StringRef *this,StringRef rhs)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong __n;
  uint uVar4;
  
  uVar3 = rhs.m_size;
  uVar1 = this->m_size;
  __n = uVar3;
  if (uVar1 < uVar3) {
    __n = uVar1;
  }
  uVar4 = 0xffffffff;
  if (uVar1 >= uVar3) {
    uVar4 = (uint)(uVar3 < uVar1);
  }
  uVar2 = strncmp(this->m_start,rhs.m_start,__n);
  if (uVar2 == 0) {
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

int StringRef::compare( StringRef rhs ) const {
        auto cmpResult =
            strncmp( m_start, rhs.m_start, std::min( m_size, rhs.m_size ) );

        // This means that strncmp found a difference before the strings
        // ended, and we can return it directly
        if ( cmpResult != 0 ) {
            return cmpResult;
        }

        // If strings are equal up to length, then their comparison results on
        // their size
        if ( m_size < rhs.m_size ) {
            return -1;
        } else if ( m_size > rhs.m_size ) {
            return 1;
        } else {
            return 0;
        }
    }